

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1515.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  char *pcVar9;
  timeval tVar10;
  undefined8 uStack_400;
  int still_running;
  long local_3e0;
  int local_3d4;
  char *local_3d0;
  timeval timeout;
  int msgs_left;
  fd_set fdexcep;
  fd_set fdwrite;
  char target_url [256];
  char dns_entry [256];
  
  pcVar9 = libtest_arg3;
  curl_msnprintf(dns_entry,0x100,"testserver.example.com:%s:%s",libtest_arg3,libtest_arg2);
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar4 = _stderr;
  if (iVar1 == 0) {
    lVar3 = curl_multi_init();
    if (lVar3 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                    ,0x83);
      iVar1 = 0x7b;
    }
    else {
      iVar8 = 1;
      local_3d0 = pcVar9;
      local_3e0 = lVar3;
LAB_0010236b:
      if (iVar8 != 3) {
        curl_msnprintf(target_url,0x100,"http://testserver.example.com:%s/%s%04d",local_3d0,URL,
                       iVar8);
        uVar4 = curl_slist_append(0,dns_entry);
        lVar3 = curl_easy_init();
        if (lVar3 == 0) {
          curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                        ,0x41);
          iVar1 = 0x7c;
        }
        else {
          iVar1 = curl_easy_setopt(lVar3,0x2712,target_url);
          uVar2 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_easy_setopt(lVar3,0x27db,uVar4);
            uVar2 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_easy_setopt(lVar3,0x4e7e,debug_callback);
              uVar2 = _stderr;
              if (iVar1 == 0) {
                iVar1 = curl_easy_setopt(lVar3,0x29,1);
                uVar2 = _stderr;
                if (iVar1 == 0) {
                  iVar1 = curl_easy_setopt(lVar3,0x5c,1);
                  uVar2 = _stderr;
                  if (iVar1 == 0) {
                    iVar1 = curl_multi_add_handle(local_3e0,lVar3);
                    uVar2 = _stderr;
                    if (iVar1 == 0) {
                      iVar1 = curl_multi_perform(local_3e0,&still_running);
                      uVar2 = _stderr;
                      if (iVar1 == 0) {
                        if (still_running < 0) {
                          pcVar9 = 
                          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                          ;
                          uStack_400 = 0x4a;
LAB_001027ec:
                          curl_mfprintf(_stderr,pcVar9,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                        ,uStack_400);
                          iVar1 = 0x7a;
                        }
                        else {
                          tVar10 = tutil_tvnow();
                          lVar6 = tutil_tvdiff(tVar10,tv_test_start);
                          if (lVar6 < 0xea61) {
                            do {
                              if (still_running == 0) goto LAB_001027a7;
                              local_3d4 = -99;
                              for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
                                (&msgs_left + lVar6 * 2)[0] = 0;
                                (&msgs_left + lVar6 * 2)[1] = 0;
                              }
                              for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
                                fdwrite.__fds_bits[lVar6] = 0;
                              }
                              for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
                                fdexcep.__fds_bits[lVar6] = 0;
                              }
                              timeout.tv_sec = 1;
                              timeout.tv_usec = 0;
                              iVar1 = curl_multi_fdset(local_3e0,&msgs_left,&fdwrite,&fdexcep,
                                                       &local_3d4);
                              uVar2 = _stderr;
                              if (iVar1 != 0) {
                                uVar5 = curl_multi_strerror(iVar1);
                                pcVar9 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                                uStack_400 = 0x59;
                                goto LAB_001025b3;
                              }
                              if (local_3d4 < -1) {
                                pcVar9 = 
                                "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                ;
                                uStack_400 = 0x59;
                                goto LAB_001027ec;
                              }
                              iVar1 = select_wrapper(local_3d4 + 1,(fd_set *)&msgs_left,&fdwrite,
                                                     &fdexcep,&timeout);
                              if (iVar1 == -1) {
                                piVar7 = __errno_location();
                                uVar2 = _stderr;
                                iVar1 = *piVar7;
                                pcVar9 = strerror(iVar1);
                                curl_mfprintf(uVar2,"%s:%d select() failed, with errno %d (%s)\n",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                              ,0x5a,iVar1,pcVar9);
                                iVar1 = 0x79;
                                goto LAB_001025c1;
                              }
                              tVar10 = tutil_tvnow();
                              lVar6 = tutil_tvdiff(tVar10,tv_test_start);
                              if (60000 < lVar6) {
                                uStack_400 = 0x5c;
                                goto LAB_00102815;
                              }
                              iVar1 = curl_multi_perform(local_3e0,&still_running);
                              uVar2 = _stderr;
                              if (iVar1 != 0) {
                                uVar5 = curl_multi_strerror(iVar1);
                                pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                                uStack_400 = 0x5d;
                                goto LAB_001025b3;
                              }
                              if (still_running < 0) {
                                pcVar9 = 
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ;
                                uStack_400 = 0x5d;
                                goto LAB_001027ec;
                              }
                              tVar10 = tutil_tvnow();
                              lVar6 = tutil_tvdiff(tVar10,tv_test_start);
                            } while (lVar6 < 0xea61);
                            uStack_400 = 0x5f;
                          }
                          else {
                            uStack_400 = 0x4c;
                          }
LAB_00102815:
                          curl_mfprintf(_stderr,
                                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                        ,uStack_400);
                          iVar1 = 0x7d;
                        }
                        goto LAB_001025c1;
                      }
                      uVar5 = curl_multi_strerror(iVar1);
                      pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                      uStack_400 = 0x4a;
                    }
                    else {
                      uVar5 = curl_multi_strerror(iVar1);
                      pcVar9 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                      uStack_400 = 0x49;
                    }
                  }
                  else {
                    uVar5 = curl_easy_strerror(iVar1);
                    pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                    uStack_400 = 0x47;
                  }
                }
                else {
                  uVar5 = curl_easy_strerror(iVar1);
                  pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                  uStack_400 = 0x46;
                }
              }
              else {
                uVar5 = curl_easy_strerror(iVar1);
                pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                uStack_400 = 0x45;
              }
            }
            else {
              uVar5 = curl_easy_strerror(iVar1);
              pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
              uStack_400 = 0x44;
            }
          }
          else {
            uVar5 = curl_easy_strerror(iVar1);
            pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            uStack_400 = 0x43;
          }
LAB_001025b3:
          curl_mfprintf(uVar2,pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                        ,uStack_400,iVar1,uVar5);
        }
        goto LAB_001025c1;
      }
      iVar1 = 0;
      lVar3 = local_3e0;
    }
LAB_0010295d:
    curl_multi_cleanup(lVar3);
  }
  else {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar4,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                  ,0x82,iVar1,uVar2);
  }
  return iVar1;
  while ((*piVar7 != 1 || (*(long *)(piVar7 + 2) != lVar3))) {
LAB_001027a7:
    piVar7 = (int *)curl_multi_info_read(local_3e0,&msgs_left);
    if (piVar7 == (int *)0x0) {
      iVar1 = 0;
      goto LAB_001025c1;
    }
  }
  iVar1 = piVar7[4];
LAB_001025c1:
  curl_multi_remove_handle(local_3e0,lVar3);
  curl_easy_cleanup(lVar3);
  curl_slist_free_all(uVar4);
  lVar3 = local_3e0;
  if (iVar1 != 0) goto LAB_0010295d;
  if (iVar8 != 2) {
    sleep(2);
  }
  iVar8 = iVar8 + 1;
  goto LAB_0010236b;
}

Assistant:

int test(char *URL)
{
  CURLM *multi = NULL;
  int res = 0;
  char *address = libtest_arg2;
  char *port = libtest_arg3;
  char *path = URL;
  char dns_entry[256];
  int i;
  int count = 2;

  snprintf(dns_entry, sizeof(dns_entry), "testserver.example.com:%s:%s",
           port, address);

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);
  multi_init(multi);

  for(i = 1; i <= count; i++) {
    char target_url[256];
    snprintf(target_url, sizeof(target_url),
             "http://testserver.example.com:%s/%s%04d", port, path, i);

    /* second request must succeed like the first one */
    res = do_one_request(multi, target_url, dns_entry);
    if(res)
      goto test_cleanup;

    if(i < count)
      sleep(DNS_TIMEOUT + 1);
  }

test_cleanup:

  curl_multi_cleanup(multi);

  return (int) res;
}